

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O2

mbedtls_cipher_info_t * mbedtls_cipher_info_from_type(mbedtls_cipher_type_t cipher_type)

{
  mbedtls_cipher_definition_t *pmVar1;
  mbedtls_cipher_info_t *pmVar2;
  mbedtls_cipher_info_t **ppmVar3;
  
  ppmVar3 = &mbedtls_cipher_definitions[0].info;
  do {
    pmVar2 = *ppmVar3;
    if (*ppmVar3 == (mbedtls_cipher_info_t *)0x0) {
      return pmVar2;
    }
    pmVar1 = (mbedtls_cipher_definition_t *)(ppmVar3 + -1);
    ppmVar3 = ppmVar3 + 2;
  } while (pmVar1->type != cipher_type);
  return pmVar2;
}

Assistant:

const mbedtls_cipher_info_t *mbedtls_cipher_info_from_type( const mbedtls_cipher_type_t cipher_type )
{
    const mbedtls_cipher_definition_t *def;

    for( def = mbedtls_cipher_definitions; def->info != NULL; def++ )
        if( def->type == cipher_type )
            return( def->info );

    return( NULL );
}